

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.cpp
# Opt level: O2

void Shell::Shuffling::shuffle(Unit *unit)

{
  Clause *clause;
  
  if ((unit->field_0x4 & 1) == 0) {
    clause = Kernel::Unit::asClause(unit);
    shuffle(clause);
    return;
  }
  shuffle(*(Formula **)(unit + 1));
  return;
}

Assistant:

void Shuffling::shuffle(Unit* unit)
{
  // cout << "Bef: " << unit->toString() << std::endl;

  if (unit->isClause()) {
    shuffle(unit->asClause());
  } else {
    shuffle(static_cast<FormulaUnit*>(unit)->formula());
  }

  // cout << "Aft: " << unit->toString() << std::endl;
}